

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TicsSpecsMajor.hpp
# Opt level: O3

void __thiscall sciplot::TicsSpecsMajor::repr_abi_cxx11_(TicsSpecsMajor *this)

{
  long in_RSI;
  
  repr_abi_cxx11_((string *)this,(TicsSpecsMajor *)(in_RSI + -0xd0));
  return;
}

Assistant:

inline auto TicsSpecsMajor::repr() const -> std::string
{
    const auto baserepr = TicsSpecsBaseOf<TicsSpecsMajor>::repr(m_axis);

    if(isHidden())
        return baserepr;

    if(m_start.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::start but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_increment.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::increment.");
    if(m_end.size() && m_start.empty())
        throw std::runtime_error("You have called method TicsSpecsMajor::end but not TicsSpecsMajor::start.");

    std::stringstream ss;
    ss << baserepr << " ";
    ss << m_at << " ";
    ss << m_add << " ";
    ss << m_logscale << " ";
    return internal::removeExtraWhitespaces(ss.str());
}